

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

void model_rd_with_curvfit
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE plane_bsize,int plane,int64_t sse,
               int num_samples,int *rate,int64_t *dist)

{
  int iVar1;
  MACROBLOCKD *xd_00;
  double *rate_f_00;
  int in_ECX;
  long in_RSI;
  long in_R8;
  int in_R9D;
  double dVar2;
  double dVar3;
  int *in_stack_00000008;
  long *in_stack_00000010;
  int64_t dist_i;
  int rate_i;
  double dist_f;
  double dist_by_sse_norm_f;
  double rate_f;
  double xqr;
  double qstepsqr;
  double sse_norm;
  int qstep;
  int dequant_shift;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  double local_98;
  double local_90;
  int local_88;
  int local_84;
  long local_80;
  int local_74;
  double local_68;
  double local_60;
  undefined4 in_stack_ffffffffffffffd8;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  rate_f_00 = (double *)(in_RSI + (long)in_ECX * 0x88);
  iVar1 = is_cur_buf_hbd(xd_00);
  if (iVar1 == 0) {
    local_84 = 3;
  }
  else {
    local_84 = xd_00->bd + -5;
  }
  if ((int)*(short *)((long)rate_f_00[0x10] + 2) >> ((byte)local_84 & 0x1f) < 2) {
    local_88 = 1;
  }
  else {
    local_88 = (int)*(short *)((long)rate_f_00[0x10] + 2) >> ((byte)local_84 & 0x1f);
  }
  if (in_R8 == 0) {
    if (in_stack_00000008 != (int *)0x0) {
      *in_stack_00000008 = 0;
    }
    if (in_stack_00000010 != (long *)0x0) {
      *in_stack_00000010 = 0;
    }
  }
  else {
    dVar2 = (double)in_R8;
    dVar3 = (double)in_R9D;
    log2((dVar2 / dVar3) / ((double)local_88 * (double)local_88));
    av1_model_rd_curvfit
              ((BLOCK_SIZE)((ulong)in_R8 >> 0x38),(double)CONCAT44(in_R9D,in_stack_ffffffffffffffd8)
               ,(double)xd_00,rate_f_00,(double *)CONCAT44(local_84,local_88));
    local_98 = local_68 * (dVar2 / dVar3);
    if (0.0 <= local_60 * (double)in_R9D) {
      local_90 = local_60 * (double)in_R9D;
    }
    else {
      local_90 = 0.0;
    }
    local_74 = (int)(local_90 + 0.5);
    if (0.0 <= local_98 * (double)in_R9D) {
      local_98 = local_98 * (double)in_R9D;
    }
    else {
      local_98 = 0.0;
    }
    local_80 = (long)(local_98 + 0.5);
    if (local_74 == 0) {
      local_80 = in_R8 << 4;
    }
    else if (in_R8 * 0x800 <=
             ((long)local_74 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + local_80 * 0x80) {
      local_74 = 0;
      local_80 = in_R8 << 4;
    }
    if (in_stack_00000008 != (int *)0x0) {
      *in_stack_00000008 = local_74;
    }
    if (in_stack_00000010 != (long *)0x0) {
      *in_stack_00000010 = local_80;
    }
  }
  return;
}

Assistant:

static inline void model_rd_with_curvfit(const AV1_COMP *const cpi,
                                         const MACROBLOCK *const x,
                                         BLOCK_SIZE plane_bsize, int plane,
                                         int64_t sse, int num_samples,
                                         int *rate, int64_t *dist) {
  (void)cpi;
  (void)plane_bsize;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = AOMMAX(p->dequant_QTX[1] >> dequant_shift, 1);

  if (sse == 0) {
    if (rate) *rate = 0;
    if (dist) *dist = 0;
    return;
  }
  const double sse_norm = (double)sse / num_samples;
  const double qstepsqr = (double)qstep * qstep;
  const double xqr = log2(sse_norm / qstepsqr);
  double rate_f, dist_by_sse_norm_f;
  av1_model_rd_curvfit(plane_bsize, sse_norm, xqr, &rate_f,
                       &dist_by_sse_norm_f);

  const double dist_f = dist_by_sse_norm_f * sse_norm;
  int rate_i = (int)(AOMMAX(0.0, rate_f * num_samples) + 0.5);
  int64_t dist_i = (int64_t)(AOMMAX(0.0, dist_f * num_samples) + 0.5);

  // Check if skip is better
  if (rate_i == 0) {
    dist_i = sse << 4;
  } else if (RDCOST(x->rdmult, rate_i, dist_i) >=
             RDCOST(x->rdmult, 0, sse << 4)) {
    rate_i = 0;
    dist_i = sse << 4;
  }

  if (rate) *rate = rate_i;
  if (dist) *dist = dist_i;
}